

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLExportTest.cpp
# Opt level: O3

void __thiscall
ODDLParser::OpenDDLExportTest_writeNodeHeaderTest_Test::TestBody
          (OpenDDLExportTest_writeNodeHeaderTest_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  DDLNode *this_00;
  char *in_R9;
  char *pcVar3;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  string statement;
  OpenDDLExportMock myExport;
  AssertHelper local_b0;
  AssertHelper local_a8;
  string local_a0;
  string local_80;
  string local_60;
  undefined **local_40;
  OpenDDLExport local_38;
  
  OpenDDLExport::OpenDDLExport(&local_38,(IOStreamBase *)0x0);
  local_40 = &PTR__OpenDDLExportMock_0018a0f8;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  bVar2 = OpenDDLExport::writeNodeHeader(&local_38,(DDLNode *)0x0,&local_60);
  local_80._M_dataplus._M_p._0_1_ = !bVar2;
  local_80._M_string_length = 0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a0,(internal *)&local_80,(AssertionResult *)"ok","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLExportTest.cpp"
               ,0x8e,local_a0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    if (local_b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_b0.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_80._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  paVar1 = &local_a0.field_2;
  local_a0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"test","");
  pcVar3 = "";
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"","");
  this_00 = DDLNode::create(&local_a0,&local_80,(DDLNode *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  DDLNode::attachParent(this_00,(this->super_OpenDDLExportTest).m_root);
  bVar2 = OpenDDLExport::writeNodeHeader(&local_38,this_00,&local_60);
  local_80._M_dataplus._M_p._0_1_ = bVar2;
  local_80._M_string_length = 0;
  if (!bVar2) {
    testing::Message::Message((Message *)&local_b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a0,(internal *)&local_80,(AssertionResult *)"ok","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLExportTest.cpp"
               ,0x93,local_a0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    if (local_b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_b0.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_80._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&local_a0,"\"test\"","statement",(char (*) [5])0x160423,&local_60);
  if ((char)local_a0._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_80);
    if ((undefined8 *)local_a0._M_string_length != (undefined8 *)0x0) {
      pcVar3 = *(char **)local_a0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLExportTest.cpp"
               ,0x94,pcVar3);
    testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    if ((long *)local_80._M_dataplus._M_p != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_80._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_80._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_a0._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_60._M_string_length = 0;
  *local_60._M_dataplus._M_p = '\0';
  bVar2 = OpenDDLExport::writeNodeHeader(&local_38,(this->super_OpenDDLExportTest).m_root,&local_60)
  ;
  local_80._M_dataplus._M_p._0_1_ = bVar2;
  local_80._M_string_length = 0;
  if (!bVar2) {
    testing::Message::Message((Message *)&local_b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a0,(internal *)&local_80,(AssertionResult *)"ok","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLExportTest.cpp"
               ,0x98,local_a0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    if (local_b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_b0.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_80._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::internal::CmpHelperEQ<char[11],std::__cxx11::string>
            ((internal *)&local_a0,"\"test $root\"","statement",(char (*) [11])"test $root",
             &local_60);
  if ((char)local_a0._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_80);
    if ((undefined8 *)local_a0._M_string_length == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_a0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLExportTest.cpp"
               ,0x99,pcVar3);
    testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    if ((long *)local_80._M_dataplus._M_p != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_80._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_80._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_a0._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,
                    CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                             local_60.field_2._M_local_buf[0]) + 1);
  }
  OpenDDLExport::~OpenDDLExport(&local_38);
  return;
}

Assistant:

TEST_F(OpenDDLExportTest, writeNodeHeaderTest) {
    OpenDDLExportMock myExport;

    bool ok(true);
    std::string statement;
    ok = myExport.writeNodeHeaderTester(nullptr, statement);
    EXPECT_FALSE(ok);

    DDLNode *node(DDLNode::create("test", ""));
    node->attachParent(m_root);
    ok = myExport.writeNodeHeaderTester(node, statement);
    EXPECT_TRUE(ok);
    EXPECT_EQ("test", statement);
    statement.clear();

    ok = myExport.writeNodeHeaderTester(m_root, statement);
    EXPECT_TRUE(ok);
    EXPECT_EQ("test $root", statement);
}